

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_lake_shrine_platforms_map.hpp
# Opt level: O2

void __thiscall
PatchOptimizeLakeShrinePlatformsMap::inject_code
          (PatchOptimizeLakeShrinePlatformsMap *this,ROM *rom,World *world)

{
  uint32_t uVar1;
  Map *pMVar2;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::DataRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  allocator_type local_10a;
  allocator_type local_109;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> local_e8;
  _Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_d0;
  Code func;
  DataRegister local_40;
  
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40.super_Register._code = '\0';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  __l._M_len = 1;
  __l._M_array = &local_40;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_e8,__l,&local_109
            );
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR_getXn_00246c60;
  local_f8._M_local_buf[8] = 1;
  local_f8._M_allocated_capacity = (size_type)&PTR_getXn_00246c60;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_108;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_d0,__l_00,
             &local_10a);
  md::Code::movem_to_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_e8,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_d0);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_d0);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base(&local_e8);
  local_108._0_8_ = &PTR_getXn_00246ce8;
  local_108._8_8_ = 0x200ff5430;
  local_e8._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::movew(&func,(Param *)local_108,(Param *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"player_not_on_entity",(allocator<char> *)&local_e8);
  md::Code::bmi(&func,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR_getXn_00246bf0;
  md::Code::cmpiw(&func,0x500,(Param *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"player_not_on_entity",(allocator<char> *)&local_e8);
  md::Code::bgt(&func,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  local_108[8] = '\x01';
  local_108._0_8_ = &PTR_getXn_00246c60;
  md::Code::lea(&func,0xff5400,(AddressRegister *)local_108);
  local_108._8_8_ = (ulong)(uint7)local_108._9_7_ << 8;
  local_108._0_8_ = &PTR_getXn_00246bf0;
  local_e8._M_impl.super__Vector_impl_data._M_finish._0_1_ = 1;
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246c60;
  md::Code::adda(&func,(Param *)local_108,(AddressRegister *)&local_e8);
  local_108._0_8_ = &PTR_getXn_00246d28;
  local_f8._M_local_buf[0] = '\x01';
  local_108._8_8_ = &PTR_getXn_00246c60;
  local_f8._8_2_ = 0x32;
  local_f8._M_local_buf[10] = '\x02';
  md::Code::cmpil(&func,0x9b458,(Param *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"player_not_on_entity",(allocator<char> *)&local_e8);
  md::Code::bne(&func,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  local_108._0_8_ = &PTR_getXn_00246d28;
  local_f8._M_local_buf[0] = '\x01';
  local_108._8_8_ = &PTR_getXn_00246c60;
  local_f8._8_2_ = 0x32;
  local_f8._M_local_buf[10] = '\x02';
  md::Code::movel(&func,0x9b652,(Param *)local_108);
  local_108._0_8_ = &PTR_getXn_00246d28;
  local_f8._M_local_buf[0] = 1;
  local_108._8_8_ = &PTR_getXn_00246c60;
  local_f8._8_2_ = 0x2a;
  local_f8._M_local_buf[10] = '\x02';
  md::Code::movew(&func,0x1d00,(Param *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"player_not_on_entity",(allocator<char> *)&local_e8);
  md::Code::label(&func,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  local_40.super_Register._code = '\0';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246bf0;
  __l_01._M_len = 1;
  __l_01._M_array = &local_40;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_e8,__l_01,
             &local_109);
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR_getXn_00246c60;
  local_f8._M_local_buf[8] = 1;
  local_f8._M_allocated_capacity = (size_type)&PTR_getXn_00246c60;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_108;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_d0,__l_02,
             &local_10a);
  md::Code::movem_from_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_e8,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_d0);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_d0);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base(&local_e8);
  md::Code::rts(&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"",(allocator<char> *)&local_e8);
  uVar1 = md::ROM::inject_code(rom,&func,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  pMVar2 = World::map(world,0x142);
  pMVar2->_map_update_addr = uVar1;
  md::Code::~Code(&func);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        constexpr uint32_t ADDR_NO_BEHAVIOR = 0x0009B458;
        constexpr uint32_t ADDR_BEHAVIOR_FALL = 0x0009B652;

        md::Code func;
        func.movem_to_stack({ reg_D0 }, { reg_A0, reg_A1 });
        {
            func.movew(addr_(0xFF5430), reg_D0);    // D0 = entity underneath player
            func.bmi("player_not_on_entity");
            func.cmpiw(0x500, reg_D0);
            func.bgt("player_not_on_entity");
            {
                // Player is on a platform
                func.lea(0xFF5400, reg_A1);
                func.adda(reg_D0, reg_A1);
                func.cmpil(ADDR_NO_BEHAVIOR, addr_(reg_A1, 0x32));
                func.bne("player_not_on_entity");
                // Player is on a platform that can actually fall, trigger the usual behavior
                func.movel(ADDR_BEHAVIOR_FALL, addr_(reg_A1, 0x32));
                func.movew(0x1D00, addr_(reg_A1, 0x2A));
            }
            func.label("player_not_on_entity");

        }
        func.movem_from_stack({ reg_D0 }, { reg_A0, reg_A1 });
        func.rts();

        uint32_t update_func_addr = rom.inject_code(func);
        world.map(MAP_LAKE_SHRINE_322)->map_update_addr(update_func_addr);
    }